

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O1

void __thiscall
flow_cutter::BasicCutter::
grow_reachable_sets<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch>
          (BasicCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph,TemporaryData *tmp,PseudoDepthFirstSearch *search_algo,int pierced_side)

{
  ArrayIDFunc<unsigned_long> *pAVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  AssimilatedNodeSet *pAVar5;
  bool bVar6;
  anon_class_1_0_00000001 on_new_arc;
  int target_hit;
  int my_source_side;
  int my_target_side;
  anon_class_8_1_b4f2a08e should_follow_arc_1;
  anon_class_8_1_7e1b71c4 should_follow_arc;
  anon_class_24_3_ea03f7d5 local_d8;
  anon_class_16_2_93407056 on_new_node;
  anon_class_16_2_0c89a5ce see_node;
  int pierced_side_local;
  anon_class_24_3_c9054677 is_backward_saturated;
  anon_class_16_2_2a318a2d is_target;
  anon_class_16_2_a16619e3 is_source;
  anon_class_24_3_815bacf1 increase_flow;
  anon_class_24_3_4039d62d is_forward_saturated;
  bool bVar7;
  
  increase_flow.pierced_side = &pierced_side_local;
  is_source.my_source_side = &my_source_side;
  my_target_side = 1 - pierced_side;
  is_backward_saturated.my_target_side = &my_target_side;
  bVar7 = false;
  bVar6 = false;
  my_source_side = pierced_side;
  pierced_side_local = pierced_side;
  is_backward_saturated.this = this;
  is_backward_saturated.graph = graph;
  is_target.this = this;
  is_target.my_target_side = is_backward_saturated.my_target_side;
  is_source.this = this;
  increase_flow.this = this;
  increase_flow.graph = graph;
  is_forward_saturated.this = this;
  is_forward_saturated.graph = graph;
  is_forward_saturated.my_source_side = is_source.my_source_side;
  while( true ) {
    target_hit = -1;
    on_new_node.is_target = &is_target;
    on_new_node.target_hit = &target_hit;
    should_follow_arc.is_forward_saturated = &is_forward_saturated;
    lVar4 = (long)my_source_side;
    should_follow_arc_1.is_backward_saturated =
         (anon_class_24_3_c9054677 *)(this->reachable + lVar4);
    local_d8.should_follow_arc = (anon_class_8_1_b4f2a08e *)&should_follow_arc;
    see_node.on_new_node = &on_new_node;
    local_d8.this = (ReachableNodeSet *)should_follow_arc_1.is_backward_saturated;
    local_d8.graph = graph;
    see_node.this = (BasicNodeSet *)should_follow_arc_1.is_backward_saturated;
    PseudoDepthFirstSearch::operator()
              (search_algo,graph,tmp,this->reachable[lVar4].node_set.extra_node,
               (anon_class_8_1_8991fb9c *)&should_follow_arc_1,&see_node,
               (anon_class_24_3_ea03f7d5 *)&local_d8,&on_new_arc);
    this->reachable[lVar4].node_set.extra_node = -1;
    if (target_hit == -1) {
      bVar3 = true;
    }
    else {
      ReachableNodeSet::
      forall_arcs_in_path_to<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BasicCutter::grow_reachable_sets<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch>(flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flo___const&,flow_cutter::TemporaryData&,flow_cutter::PseudoDepthFirstSearch_const&,int)::_lambda(int)_5_>
                (this->reachable + my_source_side,graph,&is_source,target_hit,&increase_flow);
      pAVar5 = this->assimilated + my_source_side;
      pAVar1 = &this->reachable[my_source_side].node_set.inside_flag.data_;
      pAVar1[-1].preimage_count_ = (pAVar5->node_set).node_count_inside_;
      *(int *)((long)(pAVar1 + -1) + 8) = (pAVar5->node_set).inside_flag.preimage_;
      ArrayIDFunc<unsigned_long>::operator=(pAVar1,&(pAVar5->node_set).inside_flag.data_);
      pAVar1[1].preimage_count_ = (pAVar5->node_set).extra_node;
      iVar2 = this->flow_intensity;
      this->flow_intensity = iVar2 + 1;
      bVar3 = iVar2 < this->max_flow_intensity;
      bVar6 = bVar7;
      if (iVar2 < this->max_flow_intensity) {
        bVar6 = true;
        bVar7 = bVar6;
      }
    }
    if (!bVar3) break;
    if (target_hit == -1) {
      if (bVar6) {
        pAVar5 = this->assimilated + my_target_side;
        pAVar1 = &this->reachable[my_target_side].node_set.inside_flag.data_;
        pAVar1[-1].preimage_count_ = (pAVar5->node_set).node_count_inside_;
        *(int *)((long)(pAVar1 + -1) + 8) = (pAVar5->node_set).inside_flag.preimage_;
        ArrayIDFunc<unsigned_long>::operator=(pAVar1,&(pAVar5->node_set).inside_flag.data_);
        pAVar1[1].preimage_count_ = (pAVar5->node_set).extra_node;
        should_follow_arc_1.is_backward_saturated = &is_backward_saturated;
        lVar4 = (long)my_target_side;
        local_d8.this = this->reachable + lVar4;
        local_d8.should_follow_arc = &should_follow_arc_1;
        see_node.on_new_node = (anon_class_16_2_93407056 *)&should_follow_arc;
        local_d8.graph = graph;
        on_new_node.is_target = (anon_class_16_2_2a318a2d *)local_d8.this;
        see_node.this = &(local_d8.this)->node_set;
        PseudoDepthFirstSearch::operator()
                  (search_algo,graph,tmp,this->reachable[lVar4].node_set.extra_node,
                   (anon_class_8_1_8991fb9c *)&on_new_node,(anon_class_16_2_0c89a5ce *)&see_node,
                   &local_d8,&on_new_arc);
        this->reachable[lVar4].node_set.extra_node = -1;
      }
      return;
    }
  }
  return;
}

Assistant:

void grow_reachable_sets(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo,
        int pierced_side)
    {

        int my_source_side = pierced_side;
        int my_target_side = 1 - pierced_side;

        assert(reachable[pierced_side].can_grow());

        auto is_forward_saturated = [&, this](int xy) {
            return this->is_saturated(graph, my_source_side, xy);
        };

        auto is_backward_saturated = [&, this](int xy) {
            return this->is_saturated(graph, my_target_side, xy);
        };

        auto is_source = [&](int x) {
            return assimilated[my_source_side].is_inside(x);
        };

        auto is_target = [&](int x) {
            return assimilated[my_target_side].is_inside(x);
        };

        auto increase_flow = [&](int xy) {
            if (pierced_side == source_side)
                flow.increase(graph, xy);
            else
                flow.decrease(graph, xy);
        };

        bool was_flow_augmented = false;

        int target_hit;
        do {
            target_hit = -1;
            auto on_new_node = [&](int x) {
                if (is_target(x)) {
                    target_hit = x;
                    return false;
                } else
                    return true;
            };
            auto should_follow_arc = [&](int xy) {
                return !is_forward_saturated(xy);
            };
            auto on_new_arc = [](int xy) {};
            reachable[my_source_side].grow(graph, tmp, search_algo, on_new_node,
                should_follow_arc, on_new_arc);

            if (target_hit != -1) {
                check_flow_conservation(graph);
                reachable[my_source_side].forall_arcs_in_path_to(
                    graph, is_source, target_hit, increase_flow);
                check_flow_conservation(graph);
                reachable[my_source_side].reset(assimilated[my_source_side]);

                ++flow_intensity;
                if(flow_intensity > max_flow_intensity)
                    return;
                was_flow_augmented = true;
                check_flow_conservation(graph);
            }
        } while (target_hit != -1);

        if (was_flow_augmented) {
            reachable[my_target_side].reset(assimilated[my_target_side]);
            auto on_new_node = [&](int x) { return true; };
            auto should_follow_arc = [&](int xy) {
                return !is_backward_saturated(xy);
            };
            auto on_new_arc = [](int xy) {};
            reachable[my_target_side].grow(graph, tmp, search_algo, on_new_node,
                should_follow_arc, on_new_arc);
        }
    }